

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

store * store_home(player *p)

{
  ulong uVar1;
  long lVar2;
  store *psVar3;
  ulong uVar4;
  
  if (((player->opts).opt[0x2b] == true) && (p->home == 0)) {
LAB_001c206c:
    psVar3 = (store *)0x0;
  }
  else {
    uVar4 = 0;
    uVar1 = (ulong)(uint)world->num_towns;
    if (world->num_towns < 1) {
      uVar1 = uVar4;
    }
    lVar2 = 0;
    for (; uVar1 * 0x28 - uVar4 != 0; uVar4 = uVar4 + 0x28) {
      if (*(int *)((long)&world->towns->index + uVar4) == (int)p->home) {
        lVar2 = (long)&world->towns->index + uVar4;
      }
    }
    if (lVar2 == 0) {
      __assert_fail("hometown",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                    ,0x266,"struct store *store_home(struct player *)");
    }
    psVar3 = (store *)(lVar2 + 0x18);
    do {
      psVar3 = psVar3->next;
      if (psVar3 == (store *)0x0) goto LAB_001c206c;
    } while (psVar3->sidx != store_home_idx);
  }
  return psVar3;
}

Assistant:

struct store *store_home(struct player *p)
{
	struct store *store;
	int i;
	struct town *hometown = NULL;

	if (OPT(player, birth_thrall) && !p->home) return NULL; 

	for (i = 0; i < world->num_towns; i++) {
		if (world->towns[i].index == p->home) {
			hometown = &world->towns[i];
		}
	}
	assert(hometown);

	store = hometown->stores;
	while (store) {
		if (store->sidx == store_home_idx) break;
		store = store->next;
	}
	return store;
}